

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instantiate_template_headers.hpp
# Opt level: O2

void predict_iforest(double *numeric_data,int *categ_data,bool is_col_major,size_t ncols_numeric,
                    size_t ncols_categ,double *Xc,int64_t *Xc_ind,int64_t *Xc_indptr,double *Xr,
                    int64_t *Xr_ind,int64_t *Xr_indptr,size_t nrows,int nthreads,bool standardize,
                    IsoForest *model_outputs,ExtIsoForest *model_outputs_ext,double *output_depths,
                    int64_t *tree_num,double *per_tree_depths,TreesIndexer *indexer)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer pSVar4;
  pointer puVar5;
  ulong uVar6;
  double *pdVar7;
  long lVar8;
  size_t sVar9;
  double *pdVar10;
  undefined8 uVar11;
  ScoringMetric SVar12;
  long *plVar13;
  ulong uVar14;
  long lVar15;
  undefined4 uVar16;
  PredictionData<double,_long> *prediction_data;
  undefined7 uVar17;
  ExtIsoForest *pEVar18;
  int64_t *piVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  double dVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auStack_e8 [40];
  double dStack_c0;
  double *pdStack_b8;
  int iStack_ac;
  long *plStack_a8;
  undefined1 auStack_a0 [8];
  PredictionData<double,_long> PStack_98;
  
  if (nrows == 0) {
    return;
  }
  PStack_98.nrows = nrows;
  PStack_98.Xc_ind = Xc_ind;
  PStack_98.Xc_indptr = Xc_indptr;
  PStack_98.Xr = Xr;
  PStack_98.Xr_ind = Xr_ind;
  PStack_98.Xr_indptr = Xr_indptr;
  uVar14 = nrows & 0xffffffff;
  if ((ulong)(long)nthreads <= nrows) {
    uVar14 = (ulong)(uint)nthreads;
  }
  iStack_ac = (int)uVar14;
  prediction_data =
       (PredictionData<double,_long> *)CONCAT71((int7)(uVar14 >> 8),Xc_indptr != (int64_t *)0x0);
  plStack_a8 = (long *)categ_data;
  PStack_98.numeric_data = numeric_data;
  PStack_98.categ_data = categ_data;
  PStack_98.is_col_major = is_col_major;
  PStack_98.ncols_numeric = ncols_numeric;
  PStack_98.ncols_categ = ncols_categ;
  PStack_98.Xc = Xc;
  if ((categ_data == (int *)0x0 || is_col_major) && Xc_indptr != (int64_t *)0x0) {
    prediction_data = &PStack_98;
    batched_csc_predict<double,long>
              (prediction_data,nthreads,model_outputs,model_outputs_ext,output_depths,tree_num,
               per_tree_depths);
LAB_00137a48:
    if (model_outputs != (IsoForest *)0x0) goto LAB_00137a59;
    lVar8 = (long)(model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model_outputs_ext->hplanes).
                  super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    lVar15 = lVar8 / 0x18;
    auVar25._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar25._0_8_ = lVar15;
    auVar25._12_4_ = 0x45300000;
    auStack_e8._24_8_ = auVar25._8_8_ - 1.9342813113834067e+25;
    auStack_e8._16_8_ =
         (double)auStack_e8._24_8_ + ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)
    ;
    dStack_c0 = model_outputs_ext->exp_avg_depth * (double)auStack_e8._16_8_;
    SVar12 = model_outputs_ext->scoring_metric;
    bVar20 = SVar12 == Density;
    bVar21 = SVar12 == BoxedRatio;
    uVar16 = (undefined4)CONCAT71((int7)((ulong)prediction_data >> 8),SVar12 == BoxedDensity);
    auStack_e8._12_4_ = (undefined4)CONCAT71((int7)((ulong)(lVar8 % 0x18) >> 8),1);
LAB_00137b97:
    bVar22 = SVar12 == BoxedDensity2;
  }
  else {
    if (model_outputs == (IsoForest *)0x0) {
      if ((((Xc_indptr == (int64_t *)0x0) && (model_outputs_ext->missing_action == Fail)) &&
          (Xr_indptr == (int64_t *)0x0)) &&
         ((categ_data == (int *)0x0 && (model_outputs_ext->has_range_penalty == false)))) {
        if (nrows == 1 || !is_col_major) {
          auStack_e8._16_8_ = nrows * 8;
          lVar8 = 0;
          for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
            auStack_e8._0_8_ = (double *)0x0;
            lVar15 = 0;
            uVar14 = 0;
            piVar19 = tree_num;
            pdVar7 = per_tree_depths;
            while( true ) {
              prediction_data =
                   (PredictionData<double,_long> *)
                   (model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) /
                      0x18;
              if (uVar6 <= uVar14) break;
              plVar13 = piVar19;
              if (tree_num == (int64_t *)0x0) {
                plVar13 = tree_num;
              }
              pdVar10 = (double *)(uVar6 * lVar8 + (long)pdVar7);
              if (per_tree_depths == (double *)0x0) {
                pdVar10 = (double *)0x0;
              }
              traverse_hplane_fast_rowmajor<double,long>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&prediction_data->numeric_data + lVar15),model_outputs_ext,
                         PStack_98.numeric_data + PStack_98.ncols_numeric * sVar9,
                         (double *)auStack_e8,plVar13,pdVar10,sVar9);
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 0x18;
              pdVar7 = pdVar7 + 1;
              piVar19 = (int64_t *)((long)piVar19 + auStack_e8._16_8_);
            }
            output_depths[sVar9] = (double)auStack_e8._0_8_;
            lVar8 = lVar8 + 8;
          }
        }
        else {
          auStack_e8._16_8_ = nrows * 8;
          lVar8 = 0;
          for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
            auStack_e8._0_8_ = (double *)0x0;
            lVar15 = 0;
            uVar14 = 0;
            piVar19 = tree_num;
            pdVar7 = per_tree_depths;
            while( true ) {
              prediction_data =
                   (PredictionData<double,_long> *)
                   (model_outputs_ext->hplanes).
                   super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = ((long)(model_outputs_ext->hplanes).
                             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) /
                      0x18;
              if (uVar6 <= uVar14) break;
              plVar13 = piVar19;
              if (tree_num == (int64_t *)0x0) {
                plVar13 = tree_num;
              }
              pdVar10 = (double *)(uVar6 * lVar8 + (long)pdVar7);
              if (per_tree_depths == (double *)0x0) {
                pdVar10 = (double *)0x0;
              }
              traverse_hplane_fast_colmajor<PredictionData<double,long>,long>
                        ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                         ((long)&prediction_data->numeric_data + lVar15),model_outputs_ext,
                         &PStack_98,(double *)auStack_e8,plVar13,pdVar10,sVar9);
              uVar14 = uVar14 + 1;
              lVar15 = lVar15 + 0x18;
              pdVar7 = pdVar7 + 1;
              piVar19 = (int64_t *)((long)piVar19 + auStack_e8._16_8_);
            }
            output_depths[sVar9] = (double)auStack_e8._0_8_;
            lVar8 = lVar8 + 8;
          }
        }
      }
      else {
        auStack_e8._16_8_ = nrows * 8;
        lVar8 = 0;
        for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
          auStack_e8._0_8_ = (double *)0x0;
          lVar15 = 0;
          uVar14 = 0;
          piVar19 = tree_num;
          pdVar7 = per_tree_depths;
          while( true ) {
            prediction_data =
                 (PredictionData<double,_long> *)
                 (model_outputs_ext->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = ((long)(model_outputs_ext->hplanes).
                           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) /
                    0x18;
            if (uVar6 <= uVar14) break;
            plVar13 = piVar19;
            if (tree_num == (int64_t *)0x0) {
              plVar13 = tree_num;
            }
            pdVar10 = (double *)(uVar6 * lVar8 + (long)pdVar7);
            if (per_tree_depths == (double *)0x0) {
              pdVar10 = (double *)0x0;
            }
            traverse_hplane<PredictionData<double,long>,long,ImputedData<long,double>>
                      ((vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)
                       ((long)&prediction_data->numeric_data + lVar15),model_outputs_ext,&PStack_98,
                       (double *)auStack_e8,(vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                       (ImputedData<long,_double> *)0x0,plVar13,pdVar10,sVar9);
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 0x18;
            pdVar7 = pdVar7 + 1;
            piVar19 = (int64_t *)((long)piVar19 + auStack_e8._16_8_);
          }
          output_depths[sVar9] = (double)auStack_e8._0_8_;
          lVar8 = lVar8 + 8;
        }
      }
      goto LAB_00137a48;
    }
    if (model_outputs->missing_action != Fail) {
LAB_001378ca:
      auStack_e8._0_8_ = (double *)0x0;
      dStack_c0 = (double)(nrows * 8);
      lVar8 = 0;
      pdVar7 = (double *)0x0;
      for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
        if (((ulong)pdVar7 & 1) == 0) {
          dVar23 = 0.0;
          lVar15 = 0;
          uVar14 = 0;
          piVar19 = tree_num;
          pdVar10 = per_tree_depths;
          pdStack_b8 = pdVar7;
          while( true ) {
            pvVar1 = (model_outputs->trees).
                     super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar6 = ((long)(model_outputs->trees).
                           super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
            if (uVar6 <= uVar14) break;
            plVar13 = piVar19;
            if (tree_num == (int64_t *)0x0) {
              plVar13 = tree_num;
            }
            pdVar7 = (double *)(uVar6 * lVar8 + (long)pdVar10);
            if (per_tree_depths == (double *)0x0) {
              pdVar7 = (double *)0x0;
            }
            auStack_e8._16_8_ = dVar23;
            dVar23 = traverse_itree<PredictionData<double,long>,long,ImputedData<long,double>>
                               ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                                ((long)&(pvVar1->
                                        super__Vector_base<IsoTree,_std::allocator<IsoTree>_>).
                                        _M_impl + lVar15),model_outputs,&PStack_98,
                                (vector<ImputeNode,_std::allocator<ImputeNode>_> *)0x0,
                                (ImputedData<long,_double> *)0x0,0.0,sVar9,plVar13,pdVar7,0);
            dVar23 = (double)auStack_e8._16_8_ + dVar23;
            uVar14 = uVar14 + 1;
            lVar15 = lVar15 + 0x18;
            pdVar10 = pdVar10 + 1;
            piVar19 = (int64_t *)((long)piVar19 + (long)dStack_c0);
          }
          output_depths[sVar9] = dVar23;
          pdVar7 = pdStack_b8;
        }
        lVar8 = lVar8 + 8;
      }
      if (((ulong)pdVar7 & 1) != 0) {
        std::__exception_ptr::exception_ptr::exception_ptr
                  ((exception_ptr *)auStack_a0,(exception_ptr *)auStack_e8);
        uVar11 = std::rethrow_exception((exception_ptr)auStack_a0);
        std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)auStack_e8);
        _Unwind_Resume(uVar11);
      }
      prediction_data = (PredictionData<double,_long> *)auStack_e8;
      std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)prediction_data);
      goto LAB_00137a48;
    }
    if (model_outputs->new_cat_action == Weighted) {
      bVar20 = model_outputs->cat_split_type == SingleCateg;
      if (((Xc_indptr == (int64_t *)0x0) && (Xr_indptr == (int64_t *)0x0)) &&
         (prediction_data =
               (PredictionData<double,_long> *)CONCAT71((int7)((ulong)model_outputs >> 8),bVar20),
         categ_data == (int *)0x0 || bVar20)) goto LAB_0013810c;
      goto LAB_001378ca;
    }
    prediction_data = (PredictionData<double,_long> *)model_outputs;
    if (Xc_indptr != (int64_t *)0x0 || Xr_indptr != (int64_t *)0x0) goto LAB_001378ca;
LAB_0013810c:
    if (model_outputs->has_range_penalty != false) goto LAB_001378ca;
    if ((nrows == 1 || !is_col_major) && categ_data == (int *)0x0) {
      auStack_e8._16_8_ = nrows * 8;
      lVar8 = 0;
      for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
        auStack_e8._0_8_ = (double *)0x0;
        lVar15 = 0;
        uVar14 = 0;
        piVar19 = tree_num;
        pdVar7 = per_tree_depths;
        while( true ) {
          prediction_data =
               (PredictionData<double,_long> *)
               (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) / 0x18;
          if (uVar6 <= uVar14) break;
          plVar13 = piVar19;
          if (tree_num == (int64_t *)0x0) {
            plVar13 = tree_num;
          }
          pdVar10 = (double *)(uVar6 * lVar8 + (long)pdVar7);
          if (per_tree_depths == (double *)0x0) {
            pdVar10 = (double *)0x0;
          }
          traverse_itree_fast<double,long>
                    ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&prediction_data->numeric_data + lVar15),model_outputs,
                     PStack_98.numeric_data + PStack_98.ncols_numeric * sVar9,(double *)auStack_e8,
                     plVar13,pdVar10,sVar9);
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x18;
          pdVar7 = pdVar7 + 1;
          piVar19 = (int64_t *)((long)piVar19 + auStack_e8._16_8_);
        }
        output_depths[sVar9] = (double)auStack_e8._0_8_;
        lVar8 = lVar8 + 8;
      }
    }
    else {
      auStack_e8._16_8_ = nrows * 8;
      lVar8 = 0;
      for (sVar9 = 0; sVar9 != nrows; sVar9 = sVar9 + 1) {
        auStack_e8._0_8_ = (double *)0x0;
        lVar15 = 0;
        uVar14 = 0;
        piVar19 = tree_num;
        pdVar7 = per_tree_depths;
        while( true ) {
          prediction_data =
               (PredictionData<double,_long> *)
               (model_outputs->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = ((long)(model_outputs->trees).
                         super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)prediction_data) / 0x18;
          if (uVar6 <= uVar14) break;
          plVar13 = piVar19;
          if (tree_num == (int64_t *)0x0) {
            plVar13 = tree_num;
          }
          pdVar10 = (double *)(uVar6 * lVar8 + (long)pdVar7);
          if (per_tree_depths == (double *)0x0) {
            pdVar10 = (double *)0x0;
          }
          traverse_itree_no_recurse<PredictionData<double,long>,long>
                    ((vector<IsoTree,_std::allocator<IsoTree>_> *)
                     ((long)&prediction_data->numeric_data + lVar15),model_outputs,&PStack_98,
                     (double *)auStack_e8,plVar13,pdVar10,sVar9);
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x18;
          pdVar7 = pdVar7 + 1;
          piVar19 = (int64_t *)((long)piVar19 + auStack_e8._16_8_);
        }
        output_depths[sVar9] = (double)auStack_e8._0_8_;
        lVar8 = lVar8 + 8;
      }
    }
LAB_00137a59:
    lVar8 = ((long)(model_outputs->trees).
                   super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(model_outputs->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x18;
    auVar24._8_4_ = (int)((ulong)lVar8 >> 0x20);
    auVar24._0_8_ = lVar8;
    auVar24._12_4_ = 0x45300000;
    auStack_e8._24_8_ = auVar24._8_8_ - 1.9342813113834067e+25;
    auStack_e8._16_8_ =
         (double)auStack_e8._24_8_ + ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0);
    dStack_c0 = model_outputs->exp_avg_depth * (double)auStack_e8._16_8_;
    SVar12 = model_outputs->scoring_metric;
    bVar20 = SVar12 == Density;
    uVar17 = (undefined7)((ulong)prediction_data >> 8);
    if (bVar20) {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar21 = model_outputs_ext->scoring_metric == BoxedRatio;
        bVar20 = true;
LAB_00137b84:
        uVar16 = (undefined4)CONCAT71(uVar17,model_outputs_ext->scoring_metric == BoxedDensity);
LAB_00137b8c:
        SVar12 = model_outputs_ext->scoring_metric;
        auStack_e8._12_4_ = 0;
        goto LAB_00137b97;
      }
      bVar21 = false;
LAB_00137ce6:
      bVar22 = SVar12 == BoxedDensity2;
      uVar16 = 0;
LAB_00137cef:
      auStack_e8._12_4_ = 0;
    }
    else {
      if (model_outputs_ext != (ExtIsoForest *)0x0) {
        bVar20 = model_outputs_ext->scoring_metric == Density;
        bVar21 = true;
        if (SVar12 == BoxedRatio) goto LAB_00137b84;
        bVar21 = model_outputs_ext->scoring_metric == BoxedRatio;
        uVar16 = (undefined4)CONCAT71(uVar17,1);
        if ((SVar12 == BoxedDensity) ||
           (uVar16 = (undefined4)CONCAT71(uVar17,model_outputs_ext->scoring_metric == BoxedDensity),
           SVar12 != BoxedDensity2)) goto LAB_00137b8c;
        bVar22 = true;
        goto LAB_00137cef;
      }
      bVar21 = SVar12 == BoxedRatio;
      if (SVar12 != BoxedDensity) goto LAB_00137ce6;
      uVar16 = (undefined4)CONCAT71(uVar17,1);
      bVar20 = false;
      auStack_e8._12_4_ = 0;
      bVar22 = false;
    }
  }
  pdStack_b8 = (double *)CONCAT44(pdStack_b8._4_4_,uVar16);
  if (standardize) {
    if (bVar20 || bVar22) {
      for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
        output_depths[sVar9] = output_depths[sVar9] / -(double)auStack_e8._16_8_;
      }
    }
    else if ((char)uVar16 == '\0') {
      if (bVar21) {
        for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
          output_depths[sVar9] = output_depths[sVar9] / (double)auStack_e8._16_8_;
        }
      }
      else {
        for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
          dVar23 = exp2(-output_depths[sVar9] / dStack_c0);
          output_depths[sVar9] = dVar23;
        }
      }
    }
    else {
      for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
        dVar23 = exp(output_depths[sVar9] / (double)auStack_e8._16_8_);
        output_depths[sVar9] = -dVar23;
      }
    }
  }
  else if ((bVar20 || (char)uVar16 != '\0') || bVar22) {
    for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
      dVar23 = exp(output_depths[sVar9] / (double)auStack_e8._16_8_);
      output_depths[sVar9] = dVar23;
    }
  }
  else if (bVar21) {
    for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
      output_depths[sVar9] = output_depths[sVar9] / -(double)auStack_e8._16_8_;
    }
  }
  else {
    for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
      output_depths[sVar9] = output_depths[sVar9] / (double)auStack_e8._16_8_;
    }
  }
  if ((per_tree_depths != (double *)0x0) && ((bVar20 || ((ulong)pdStack_b8 & 1) != 0) || bVar22)) {
    pEVar18 = (ExtIsoForest *)model_outputs;
    if (auStack_e8[0xc] != '\0') {
      pEVar18 = model_outputs_ext;
    }
    pvVar2 = (pEVar18->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pvVar3 = (pEVar18->hplanes).
             super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    for (lVar8 = 0; (((long)pvVar2 - (long)pvVar3) / 0x18) * nrows - lVar8 != 0; lVar8 = lVar8 + 1)
    {
      dVar23 = exp(per_tree_depths[lVar8]);
      per_tree_depths[lVar8] = dVar23;
    }
  }
  if (tree_num == (int64_t *)0x0) {
    return;
  }
  if ((indexer == (TreesIndexer *)0x0) ||
     (pSVar4 = (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_start,
     pSVar4 == (indexer->indices).
               super__Vector_base<SingleTreeIndex,_std::allocator<SingleTreeIndex>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
LAB_00137f70:
    remap_terminal_trees<PredictionData<double,long>,long>
              (model_outputs,model_outputs_ext,&PStack_98,tree_num,iStack_ac);
  }
  else {
    if (auStack_e8[0xc] == '\0') {
      if ((model_outputs->missing_action == Divide) ||
         (((lVar8 = (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(model_outputs->trees).
                          super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
           model_outputs->new_cat_action == Weighted && (plStack_a8 != (long *)0x0)) &&
          (model_outputs->cat_split_type == SubSet)))) goto LAB_00137f70;
    }
    else {
      lVar8 = (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model_outputs_ext->hplanes).
                    super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
    }
    for (lVar15 = 0; lVar15 != lVar8 / 0x18; lVar15 = lVar15 + 1) {
      puVar5 = pSVar4[lVar15].terminal_node_mappings.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar9 = 0; nrows != sVar9; sVar9 = sVar9 + 1) {
        tree_num[sVar9] = puVar5[tree_num[sVar9]];
      }
      tree_num = tree_num + nrows;
    }
  }
  return;
}

Assistant:

ISOTREE_EXPORTED void predict_iforest(real_t numeric_data[], int categ_data[],
                     bool is_col_major, size_t ncols_numeric, size_t ncols_categ,
                     real_t Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                     real_t Xr[], sparse_ix Xr_ind[], sparse_ix Xr_indptr[],
                     size_t nrows, int nthreads, bool standardize,
                     IsoForest *model_outputs, ExtIsoForest *model_outputs_ext,
                     double output_depths[],   sparse_ix tree_num[],
                     double per_tree_depths[],
                     TreesIndexer *indexer)
{
    predict_iforest<real_t, sparse_ix>
                    (numeric_data, categ_data,
                     is_col_major, ncols_numeric, ncols_categ,
                     Xc, Xc_ind, Xc_indptr,
                     Xr, Xr_ind, Xr_indptr,
                     nrows, nthreads, standardize,
                     model_outputs, model_outputs_ext,
                     output_depths,   tree_num,
                     per_tree_depths,
                     indexer);
}